

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

qpdf_oh qpdf_oh_parse(qpdf_data qpdf,char *object_str)

{
  char *qpdf_00;
  uint uVar1;
  anon_class_8_1_dd1422ef local_60;
  function<unsigned_int_(_qpdf_data_*)> local_58;
  function<unsigned_int_()> local_38;
  char *local_18;
  char *object_str_local;
  qpdf_data qpdf_local;
  
  local_18 = object_str;
  object_str_local = (char *)qpdf;
  QTC::TC("qpdf","qpdf-c called qpdf_oh_parse",0);
  qpdf_00 = object_str_local;
  return_uninitialized(&local_38,(qpdf_data)object_str_local);
  local_60.object_str = local_18;
  std::function<unsigned_int(_qpdf_data*)>::function<qpdf_oh_parse::__0,void>
            ((function<unsigned_int(_qpdf_data*)> *)&local_58,&local_60);
  uVar1 = trap_oh_errors<unsigned_int>((qpdf_data)qpdf_00,&local_38,&local_58);
  std::function<unsigned_int_(_qpdf_data_*)>::~function(&local_58);
  std::function<unsigned_int_()>::~function(&local_38);
  return uVar1;
}

Assistant:

qpdf_oh
qpdf_oh_parse(qpdf_data qpdf, char const* object_str)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_oh_parse");
    return trap_oh_errors<qpdf_oh>(qpdf, return_uninitialized(qpdf), [object_str](qpdf_data q) {
        return new_object(q, QPDFObjectHandle::parse(object_str));
    });
}